

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

int rtosc::enum_key(MetaContainer meta,char *value)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  int local_5c;
  MetaIterator local_58;
  MetaIterator local_48;
  
  if ((meta.str_ptr != (char *)0x0) && (*meta.str_ptr == ':')) {
    meta.str_ptr = meta.str_ptr + 1;
  }
  Port::MetaIterator::MetaIterator(&local_48,meta.str_ptr);
  local_58.title = local_48.title;
  local_58.value = local_48.value;
  Port::MetaIterator::MetaIterator(&local_48,(char *)0x0);
  if (local_58.title == local_48.title) {
    local_5c = -0x80000000;
  }
  else {
    local_5c = -0x80000000;
    do {
      pcVar2 = local_58.title;
      pcVar4 = strstr(local_58.title,"map ");
      bVar1 = true;
      if ((pcVar4 != (char *)0x0) && (iVar3 = strcmp(local_58.value,value), iVar3 == 0)) {
        local_5c = atoi(pcVar2 + 4);
        bVar1 = false;
      }
    } while ((bVar1) &&
            (Port::MetaIterator::operator++(&local_58), local_58.title != local_48.title));
  }
  return local_5c;
}

Assistant:

int rtosc::enum_key(Port::MetaContainer meta, const char* value)
{
    int result = std::numeric_limits<int>::min();

    for(auto m:meta)
    if(strstr(m.title, "map "))
    if(!strcmp(m.value, value))
    {
        result = atoi(m.title+4);
        break;
    }

    assert(!meta["min"] || result >= atoi(meta["min"]));
    assert(!meta["max"] || result <= atoi(meta["max"]));

    return result;
}